

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O3

err_t cmdFileDrop(char *name,size_t count)

{
  bool_t bVar1;
  bool_t bVar2;
  file_t file;
  size_t sVar3;
  err_t eVar4;
  
  file = fileOpen(name,"r+b");
  if (file == (file_t)0x0) {
    eVar4 = 0xcb;
  }
  else {
    sVar3 = fileSize(file);
    if (sVar3 == 0xffffffffffffffff) {
      eVar4 = 0xcf;
    }
    else {
      eVar4 = 0xd1;
      if (count <= sVar3) {
        bVar1 = fileTrunc(file,sVar3 - count);
        bVar2 = fileClose(file);
        if (bVar1 == 0) {
          return 0xce;
        }
        if (bVar2 == 0) {
          return 0x67;
        }
        return 0;
      }
    }
    fileClose(file);
  }
  return eVar4;
}

Assistant:

err_t cmdFileDrop(const char* name, size_t count)
{
	err_t code;
	file_t file;
	size_t size;
	// pre
	ASSERT(strIsValid(name));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < count)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// обрезать файл
	if (!fileTrunc(file, size - count))
		code = ERR_FILE_WRITE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}